

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long,_unsigned_long> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::find_adjacent_children
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t child)

{
  bt_impl_t *pbVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  bt_impl_t *pbVar4;
  anon_class_32_4_9a2c180c *paVar5;
  bt_impl_t *in_RDX;
  subtree_ref_base<true> *in_RSI;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *in_RDI;
  bool bVar6;
  size_t total;
  size_t i;
  pair<unsigned_long,_unsigned_long> window;
  size_t maxfreeslots;
  size_t freeslots;
  size_t end;
  size_t begin;
  anon_class_32_4_9a2c180c count;
  size_t max_count;
  bool is_leaf;
  unsigned_long *in_stack_fffffffffffffed8;
  anon_class_32_4_9a2c180c *in_stack_fffffffffffffee0;
  unsigned_long *in_stack_fffffffffffffee8;
  uint7 in_stack_fffffffffffffef8;
  bt_impl_t *local_100;
  long local_f8;
  pair<unsigned_long,_unsigned_long> local_c8;
  bt_impl_t *local_b8;
  size_t in_stack_ffffffffffffff58;
  anon_class_32_4_9a2c180c *this_00;
  anon_class_32_4_9a2c180c *this_01;
  anon_class_32_4_9a2c180c *local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  bt_impl_t *local_80;
  bt_impl_t *local_78;
  undefined1 *local_70;
  long *local_68;
  undefined1 *local_60;
  long local_50;
  subtree_ref_base<true> local_48;
  undefined1 local_19;
  
  subtree_ref_base<true>::child(in_RSI,(size_t)in_RDX);
  local_19 = subtree_ref_base<true>::is_leaf(&local_48);
  if ((bool)local_19) {
    local_f8 = 0x1000;
  }
  else {
    local_f8 = in_RSI->_rank + 1;
  }
  local_50 = local_f8;
  local_68 = &local_50;
  local_60 = &local_19;
  if (in_RDX < in_RSI[1]._vector) {
    local_100 = (bt_impl_t *)0x0;
  }
  else {
    local_100 = (bt_impl_t *)((long)in_RDX + (1 - (long)in_RSI[1]._vector));
  }
  local_78 = local_100;
  local_88 = (long)&(in_RSI[1]._vector)->capacity + (long)&local_100->capacity;
  local_90 = in_RSI->_rank + 1;
  local_70 = &stack0x00000008;
  puVar2 = std::min<unsigned_long>(&local_88,&local_90);
  local_80 = (bt_impl_t *)*puVar2;
  local_98 = (anon_class_32_4_9a2c180c *)0x0;
  this_00 = (anon_class_32_4_9a2c180c *)0x0;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            ((pair<unsigned_long,_unsigned_long> *)&stack0xffffffffffffff50,
             (unsigned_long *)&local_78,(unsigned_long *)&local_80);
  for (local_b8 = local_78; this_01 = local_98, paVar5 = local_98, local_b8 < local_80;
      local_b8 = (bt_impl_t *)((long)&local_b8->capacity + 1)) {
    sVar3 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      (this_00,in_stack_ffffffffffffff58);
    local_98 = (anon_class_32_4_9a2c180c *)((long)&local_98->t + sVar3);
  }
  while( true ) {
    local_98 = paVar5;
    pbVar1 = local_80;
    bVar6 = false;
    if (local_78 < in_RDX) {
      pbVar4 = (bt_impl_t *)
               subtree_ref_base<true>::nchildren
                         ((subtree_ref_base<true> *)(ulong)in_stack_fffffffffffffef8);
      bVar6 = pbVar1 < pbVar4;
    }
    if (!bVar6) break;
    sVar3 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      (this_01,in_stack_ffffffffffffff58);
    in_stack_fffffffffffffee8 = (unsigned_long *)((long)local_98 - sVar3);
    sVar3 = find_adjacent_children::anon_class_32_4_9a2c180c::operator()
                      (this_01,in_stack_ffffffffffffff58);
    paVar5 = (anon_class_32_4_9a2c180c *)((long)in_stack_fffffffffffffee8 + sVar3);
    local_78 = (bt_impl_t *)((long)&local_78->capacity + 1);
    local_80 = (bt_impl_t *)((long)&local_80->capacity + 1);
    in_stack_fffffffffffffee0 = local_98;
    if (this_01 < paVar5) {
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_c8,(unsigned_long *)&local_78,(unsigned_long *)&local_80);
      std::pair<unsigned_long,_unsigned_long>::operator=
                ((pair<unsigned_long,_unsigned_long> *)&stack0xffffffffffffff50,&local_c8);
      in_stack_fffffffffffffee0 = local_98;
      this_01 = paVar5;
    }
  }
  std::make_tuple<unsigned_long&,unsigned_long&,unsigned_long&>
            (in_stack_fffffffffffffee8,(unsigned_long *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  return in_RDI;
}

Assistant:

std::tuple<size_t, size_t, size_t>
        bt_impl<W, AP>::find_adjacent_children(subtree_const_ref t,
                                               size_t child)
        {
            const bool is_leaf = t.child(child).is_leaf();
            const size_t max_count = is_leaf ? leaf_bits : (degree + 1);
            const auto count = [&](size_t i) {
                return t.pointers(i) == 0 ? max_count :
                       is_leaf            ? leaf_bits - t.child(i).size() :
                                            (degree + 1) - t.child(i).nchildren();
            };
            
            size_t begin = child >= buffer ? child - buffer + 1 : 0;
            size_t end = min(begin + buffer, degree + 1);
            
            size_t freeslots = 0;
            size_t maxfreeslots = 0;
            std::pair<size_t, size_t> window = { begin, end };
            
            // Sum for the initial window
            for(size_t i = begin; i < end; ++i)
                freeslots += count(i);
            maxfreeslots = freeslots;
            
            // Slide the window
            while(begin < child && end < t.nchildren())
            {
                freeslots = freeslots - count(begin) + count(end);
                
                begin += 1;
                end += 1;
                
                if(freeslots > maxfreeslots) {
                    window = { begin, end };
                    maxfreeslots = freeslots;
                }
            }
            
            // Reverse the count of free slots to get the total number of bits
            size_t total = max_count * buffer - maxfreeslots;
            
            assert(window.first <= child && child < window.second);
            return std::make_tuple( window.first, window.second, total );
        }